

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::SamplerTest::init
          (SamplerTest *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int extraout_EAX;
  RequiredExtensions extensions;
  UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> ctxInfo;
  ContextType local_54;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_50;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_38;
  UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> local_18;
  
  local_18.m_data.ptr = glu::ContextInfo::create(this->m_renderCtx);
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50._M_impl.super__Vector_impl_data._M_start._0_4_ =
       (*this->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = isCoreTextureParam((ContextType *)&local_50,this->m_pname);
  if (!bVar1) {
    local_54.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
    getTextureParamExtension((RequiredExtensions *)&local_50,&local_54,this->m_pname);
    RequiredExtensions::add((RequiredExtensions *)&local_38,(RequiredExtensions *)&local_50);
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_50);
  }
  local_50._M_impl.super__Vector_impl_data._M_start._0_4_ =
       (*this->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = isCoreQuery((ContextType *)&local_50,this->m_type);
  if (!bVar1) {
    local_54.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
    getQueryExtension((RequiredExtensions *)&local_50,&local_54,this->m_type);
    RequiredExtensions::add((RequiredExtensions *)&local_38,(RequiredExtensions *)&local_50);
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_50);
  }
  local_50._M_impl.super__Vector_impl_data._M_start._0_4_ =
       (*this->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = isCoreTester((ContextType *)&local_50,this->m_tester);
  if (!bVar1) {
    local_54.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
    getTesterExtension((RequiredExtensions *)&local_50,&local_54,this->m_tester);
    RequiredExtensions::add((RequiredExtensions *)&local_38,(RequiredExtensions *)&local_50);
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_50);
  }
  RequiredExtensions::check((RequiredExtensions *)&local_38,local_18.m_data.ptr);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_38);
  de::details::UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::~UniqueBase
            (&local_18);
  return extraout_EAX;
}

Assistant:

void SamplerTest::init (void)
{
	const de::UniquePtr<glu::ContextInfo>	ctxInfo		(glu::ContextInfo::create(m_renderCtx));
	RequiredExtensions						extensions;

	// param
	if (!isCoreTextureParam(m_renderCtx.getType(), m_pname))
		extensions.add(getTextureParamExtension(m_renderCtx.getType(), m_pname));

	// query
	if (!isCoreQuery(m_renderCtx.getType(), m_type))
		extensions.add(getQueryExtension(m_renderCtx.getType(), m_type));

	// test type
	if (!isCoreTester(m_renderCtx.getType(), m_tester))
		extensions.add(getTesterExtension(m_renderCtx.getType(), m_tester));

	extensions.check(*ctxInfo);
}